

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix3 * matrix3_multiply(matrix3 *self,matrix3 *mT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = (self->field_0).m[3];
  dVar2 = (mT->field_0).m[0];
  dVar3 = (mT->field_0).m[1];
  dVar4 = (self->field_0).m[0];
  dVar5 = (self->field_0).m[1];
  dVar6 = (self->field_0).m[6];
  dVar7 = (mT->field_0).m[2];
  dVar8 = (self->field_0).m[4];
  dVar9 = (self->field_0).m[7];
  dVar10 = (self->field_0).m[2];
  dVar11 = (self->field_0).m[5];
  dVar12 = (self->field_0).m[8];
  dVar13 = (mT->field_0).m[3];
  dVar14 = (mT->field_0).m[4];
  dVar15 = (mT->field_0).m[5];
  dVar16 = (mT->field_0).m[7];
  dVar17 = (mT->field_0).m[6];
  dVar18 = (mT->field_0).m[8];
  (self->field_0).m[0] = dVar6 * dVar7 + dVar4 * dVar2 + dVar1 * dVar3;
  (self->field_0).m[1] = dVar9 * dVar7 + dVar5 * dVar2 + dVar3 * dVar8;
  (self->field_0).m[2] = dVar7 * dVar12 + dVar2 * dVar10 + dVar3 * dVar11;
  (self->field_0).m[3] = dVar6 * dVar15 + dVar4 * dVar13 + dVar1 * dVar14;
  (self->field_0).m[4] = dVar9 * dVar15 + dVar5 * dVar13 + dVar8 * dVar14;
  (self->field_0).m[5] = dVar15 * dVar12 + dVar13 * dVar10 + dVar14 * dVar11;
  (self->field_0).m[6] = dVar6 * dVar18 + dVar4 * dVar17 + dVar1 * dVar16;
  (self->field_0).m[7] = dVar9 * dVar18 + dVar5 * dVar17 + dVar8 * dVar16;
  (self->field_0).m[8] = dVar12 * dVar18 + dVar10 * dVar17 + dVar11 * dVar16;
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_multiply(struct matrix3 *self, const struct matrix3 *mT)
{
	/* mT is the multiplicand */

	struct matrix3 r;

	matrix3_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22;

	matrix3_set(self, &r); /* overwrite/save it */

	return self;
}